

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::AddDrawList(ImDrawData *this,ImDrawList *draw_list)

{
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  ImGui::AddDrawListToDrawDataEx(this,&this->CmdLists,draw_list);
  return;
}

Assistant:

void ImDrawData::AddDrawList(ImDrawList* draw_list)
{
    IM_ASSERT(CmdLists.Size == CmdListsCount);
    draw_list->_PopUnusedDrawCmd();
    ImGui::AddDrawListToDrawDataEx(this, &CmdLists, draw_list);
}